

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

prod_bitset * __thiscall
CppGenerator::computeLoopMasks
          (prod_bitset *__return_storage_ptr__,CppGenerator *this,prod_bitset presentFunctions,
          dyn_bitset *consideredLoops,var_bitset *varOrderBitset,var_bitset *relationBag,
          dyn_bitset *contributingViews,dyn_bitset *nextVariable,dyn_bitset *prefixLoops)

{
  ulong *puVar1;
  vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *this_00;
  pointer pdVar2;
  pointer pdVar3;
  pointer pvVar4;
  byte bVar5;
  bool bVar6;
  size_t sVar7;
  Function *pFVar8;
  View *pVVar9;
  size_type sVar10;
  ostream *poVar11;
  long lVar12;
  size_t incID;
  ulong v_id;
  ulong uVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  size_t v;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  byte bVar20;
  _Base_bitset<24UL> in_stack_fffffffffffffbf8;
  dyn_bitset loopFactors;
  dyn_bitset nextConsideredLoops;
  dyn_bitset nextLoops;
  dyn_bitset remainingLoops;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_1d0;
  prod_bitset loopFunctionMask;
  undefined8 local_f0 [24];
  
  bVar20 = 0;
  sVar7 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&loopFactors,sVar7 + 1,0,(allocator<unsigned_long> *)&loopFunctionMask);
  sVar7 = QueryCompiler::numberOfViews
                    ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&nextLoops,sVar7 + 1,0,(allocator<unsigned_long> *)&loopFunctionMask);
  uVar18 = 0;
  memset(&loopFunctionMask,0,0xc0);
  do {
    if (uVar18 == 0x5dc) {
      pdVar2 = (this->listOfLoops).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pdVar3 = (this->listOfLoops).
               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(&this->listOfLoops,consideredLoops);
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                (&this->functionsPerLoop,&loopFunctionMask);
      this_00 = &this->functionsPerLoopBranch;
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                (this_00,&loopFunctionMask);
      std::
      vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::push_back(&this->viewsPerLoop,nextVariable);
      remainingLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      remainingLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      remainingLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
      ::emplace_back<std::vector<unsigned_long,std::allocator<unsigned_long>>>
                ((vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                  *)&this->nextLoopsPerLoop,&remainingLoops.m_bits);
      lVar19 = (long)pdVar2 - (long)pdVar3 >> 5;
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
      pvVar4 = (this->nextLoopsPerLoop).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::bitset<1500UL>::operator~((bitset<1500UL> *)&remainingLoops,&loopFunctionMask);
      std::_Base_bitset<24UL>::_M_do_and
                (&presentFunctions.super__Base_bitset<24UL>,(_Base_bitset<24UL> *)&remainingLoops);
      uVar18 = 0;
      while( true ) {
        sVar7 = QueryCompiler::numberOfViews
                          ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        if (sVar7 + 1 <= uVar18) break;
        uVar13 = 1L << ((byte)uVar18 & 0x3f);
        uVar16 = uVar18 >> 6;
        if ((nextLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar16] >> (uVar18 & 0x3f) & 1) != 0) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    (&nextConsideredLoops,consideredLoops);
          nextConsideredLoops.m_bits.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] =
               nextConsideredLoops.m_bits.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar16] | uVar13;
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(nextVariable);
          puVar1 = (nextVariable->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar16;
          *puVar1 = *puVar1 | uVar13;
          remainingLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)((long)(this->listOfLoops).
                               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->listOfLoops).
                               super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                    (pvVar4 + lVar19,(unsigned_long *)&remainingLoops);
          memcpy(local_f0,&presentFunctions,0xc0);
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
                    (&local_1d0,&nextConsideredLoops);
          puVar14 = local_f0;
          puVar15 = (undefined8 *)&stack0xfffffffffffffbf8;
          for (lVar12 = 0x18; lVar12 != 0; lVar12 = lVar12 + -1) {
            *puVar15 = *puVar14;
            puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
            puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
          }
          computeLoopMasks((prod_bitset *)&remainingLoops,this,
                           (prod_bitset)in_stack_fffffffffffffbf8._M_w,&local_1d0,varOrderBitset,
                           relationBag,contributingViews,nextVariable,prefixLoops);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1d0);
          std::_Base_bitset<24UL>::_M_do_or
                    (&(this_00->
                      super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[lVar19].super__Base_bitset<24UL>,
                     (_Base_bitset<24UL> *)&remainingLoops);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &nextConsideredLoops);
        }
        uVar18 = uVar18 + 1;
      }
      memcpy(__return_storage_ptr__,
             (this_00->
             super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>)._M_impl
             .super__Vector_impl_data._M_start + lVar19,0xc0);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&nextLoops);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&loopFactors);
      return __return_storage_ptr__;
    }
    if ((presentFunctions.super__Base_bitset<24UL>._M_w[uVar18 >> 6] >> (uVar18 & 0x3f) & 1) != 0) {
      pFVar8 = QueryCompiler::getFunction
                         ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr,uVar18);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset(&loopFactors);
      for (uVar16 = 0; uVar16 != 100; uVar16 = uVar16 + 1) {
        uVar17 = uVar16 >> 6;
        uVar13 = 1L << ((byte)uVar16 & 0x3f);
        if ((((pFVar8->_fVars).super__Base_bitset<2UL>._M_w[uVar17] >> (uVar16 & 0x3f) & 1) != 0) &&
           (((varOrderBitset->super__Base_bitset<2UL>)._M_w[uVar17] & uVar13) == 0)) {
          if (((relationBag->super__Base_bitset<2UL>)._M_w[uVar17] & uVar13) == 0) {
            v_id = 0;
            while( true ) {
              sVar7 = QueryCompiler::numberOfViews
                                ((this->_qc).
                                 super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr);
              if (sVar7 <= v_id) break;
              bVar5 = (byte)v_id;
              if (((contributingViews->m_bits).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[v_id >> 6] >> (v_id & 0x3f) & 1) != 0) {
                pVVar9 = QueryCompiler::getView
                                   ((this->_qc).
                                    super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr,v_id);
                if (((pVVar9->_fVars).super__Base_bitset<2UL>._M_w[uVar17] & uVar13) != 0) {
                  uVar13 = (v_id >> 6) << 3;
                  goto LAB_001b36d7;
                }
              }
              v_id = v_id + 1;
            }
          }
          else {
            sVar7 = QueryCompiler::numberOfViews
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            bVar5 = (byte)sVar7;
            uVar13 = sVar7 >> 3 & 0xfffffffffffffff8;
LAB_001b36d7:
            *(ulong *)(uVar13 + (long)loopFactors.m_bits.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start) =
                 *(ulong *)(uVar13 + (long)loopFactors.m_bits.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_start) |
                 1L << (bVar5 & 0x3f);
          }
        }
      }
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                (&remainingLoops,prefixLoops);
      boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator&=
                (&loopFactors,&remainingLoops);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
      bVar6 = boost::operator==(&loopFactors,consideredLoops);
      if (bVar6) {
        std::bitset<1500UL>::set(&loopFunctionMask,uVar18,true);
      }
      else {
        boost::operator&(&remainingLoops,consideredLoops,&loopFactors);
        bVar6 = boost::operator==(&remainingLoops,consideredLoops);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops);
        if (bVar6) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator~
                    (&nextConsideredLoops,consideredLoops);
          boost::operator&(&remainingLoops,&loopFactors,&nextConsideredLoops);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &nextConsideredLoops);
          bVar6 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::any
                            (&remainingLoops);
          if (bVar6) {
            sVar7 = QueryCompiler::numberOfViews
                              ((this->_qc).
                               super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
            do {
              uVar16 = sVar7;
              if (uVar16 == 0) break;
              sVar7 = uVar16 - 1;
            } while (((consideredLoops->m_bits).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0);
            sVar10 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                               (&remainingLoops,uVar16);
            if (sVar10 == 0xffffffffffffffff) {
              poVar11 = std::operator<<((ostream *)&std::cerr,
                                        "We found a remaining Loop which is not higher ");
              std::operator<<(poVar11," than the highest considered loop?!\n");
              exit(1);
            }
            nextLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start[sVar10 >> 6] =
                 nextLoops.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start[sVar10 >> 6] | 1L << ((byte)sVar10 & 0x3f)
            ;
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&remainingLoops)
          ;
        }
      }
    }
    uVar18 = uVar18 + 1;
  } while( true );
}

Assistant:

prod_bitset CppGenerator::computeLoopMasks(
    prod_bitset presentFunctions, dyn_bitset consideredLoops,
    const var_bitset& varOrderBitset, const var_bitset& relationBag,
    const dyn_bitset& contributingViews, dyn_bitset& nextVariable,
    const dyn_bitset& prefixLoops)
{
    dyn_bitset loopFactors(_qc->numberOfViews()+1);
    dyn_bitset nextLoops(_qc->numberOfViews()+1);
    
    prod_bitset loopFunctionMask;
    
    // then find all loops required to compute these functions and create masks
    for (size_t f = 0; f < NUM_OF_FUNCTIONS; f++)
    {
        if (presentFunctions[f])
        {
            const var_bitset& functionVars = _qc->getFunction(f)->_fVars;
            loopFactors.reset();
            
            for (size_t v = 0; v < NUM_OF_VARIABLES; ++v)
            {
                if (functionVars[v] && !varOrderBitset[v])
                {
                    if (relationBag[v])
                        loopFactors.set(_qc->numberOfViews());
                    else
                    {
                        for (size_t incID = 0; incID < _qc->numberOfViews(); ++incID)
                        {
                            if (contributingViews[incID])
                            {
                                const var_bitset& incViewBitset =
                                    _qc->getView(incID)->_fVars;

                                if (incViewBitset[v])
                                {
                                    loopFactors.set(incID);
                                    break;
                                }
                            }
                        }
                    }
                }
            }

            loopFactors &= ~prefixLoops;
            
            if (loopFactors == consideredLoops)
            {
                // Add this function to the mask for this loop
                loopFunctionMask.set(f);
            }
            else
            {
                if ((consideredLoops & loopFactors) == consideredLoops)
                {
                    dyn_bitset remainingLoops = loopFactors & ~consideredLoops;
                    if (remainingLoops.any())
                    {
                        size_t highestPosition = 0;
                        // need to continue with this the next loop
                        for (size_t view=_qc->numberOfViews(); view > 0; view--)
                        {
                            if (consideredLoops[view])
                            {
                                highestPosition = view;
                                break;
                            }
                        }

                        size_t next = remainingLoops.find_next(highestPosition);
                        if (next != boost::dynamic_bitset<>::npos)
                            nextLoops.set(next);
                        else
                        {
                            ERROR("We found a remaining Loop which is not higher " <<
                                  " than the highest considered loop?!\n");
                            exit(1);
                        }
                    }
                }
            }
        }
    }

    // Then use the registrar to split the functions to their loops
    
    size_t numOfLoops = listOfLoops.size();
    listOfLoops.push_back(consideredLoops);
    functionsPerLoop.push_back(loopFunctionMask);
    functionsPerLoopBranch.push_back(loopFunctionMask);
    viewsPerLoop.push_back(nextVariable);
    nextLoopsPerLoop.push_back(std::vector<size_t>());
        
    std::vector<size_t>& nextLoopIDs = nextLoopsPerLoop[numOfLoops];

    presentFunctions &= ~loopFunctionMask;

    // Recurse to the next loops
    for (size_t viewID=0; viewID < _qc->numberOfViews() + 1; ++viewID)
    {
        if (nextLoops[viewID])
        {
            dyn_bitset nextConsideredLoops = consideredLoops;
            nextConsideredLoops.set(viewID);

            nextVariable.reset();
            nextVariable.set(viewID);
            
            nextLoopIDs.push_back(listOfLoops.size());
            
            prod_bitset nextLoopFunctions = computeLoopMasks(
                presentFunctions,nextConsideredLoops,varOrderBitset,
                relationBag,contributingViews,nextVariable, prefixLoops);
            
            functionsPerLoopBranch[numOfLoops] |= nextLoopFunctions;
        }
    }
    
    return functionsPerLoopBranch[numOfLoops];
}